

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto3.upb.h
# Opt level: O2

bool protobuf_test_messages_proto3_TestAllTypesProto3_map_int32_int32_set
               (protobuf_test_messages_proto3_TestAllTypesProto3 *msg,int32_t key,int32_t val,
               upb_Arena *a)

{
  upb_MapInsertStatus uVar1;
  upb_Map *map;
  int32_t val_local;
  int32_t key_local;
  upb_MiniTableField field;
  
  field.number_dont_copy_me__upb_internal_use_only = 0x38;
  field.offset_dont_copy_me__upb_internal_use_only = 0x1c0;
  field.presence = 0;
  field.submsg_index_dont_copy_me__upb_internal_use_only = 5;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  field.mode_dont_copy_me__upb_internal_use_only = 0xc0;
  val_local = val;
  key_local = key;
  map = _upb_Message_GetOrCreateMutableMap
                  (&msg->base_dont_copy_me__upb_internal_use_only,&field,4,4,a);
  uVar1 = _upb_Map_Insert(map,&key_local,4,&val_local,4,a);
  return uVar1 != kUpb_MapInsertStatus_OutOfMemory;
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto3_TestAllTypesProto3_map_int32_int32_set(protobuf_test_messages_proto3_TestAllTypesProto3* msg, int32_t key, int32_t val, upb_Arena* a) {
  const upb_MiniTableField field = {56, UPB_SIZE(144, 448), 0, 5, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto3__TestAllTypesProto3__MapInt32Int32Entry_msg_init);
  upb_Map* map = _upb_Message_GetOrCreateMutableMap(UPB_UPCAST(msg),
                                                    &field, sizeof(key), sizeof(val), a);
  return _upb_Map_Insert(map, &key, sizeof(key), &val, sizeof(val), a) !=
         kUpb_MapInsertStatus_OutOfMemory;
}